

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_3::traverseVariablePath
               (vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                *typePath,string *path,VariableDeclaration *var)

{
  string *psVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  VariablePathComponent local_58;
  string local_48;
  VariableDeclaration *local_28;
  VariableDeclaration *var_local;
  string *path_local;
  vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
  *typePath_local;
  
  local_28 = var;
  var_local = (VariableDeclaration *)path;
  path_local = (string *)typePath;
  auVar5 = std::__cxx11::string::c_str();
  glu::parseVariableName_abi_cxx11_(&local_48,auVar5._0_8_,auVar5._8_8_);
  bVar2 = std::operator!=(&local_48,&local_28->name);
  std::__cxx11::string::~string((string *)&local_48);
  psVar1 = path_local;
  if (bVar2) {
    typePath_local._7_1_ = false;
  }
  else {
    ProgramInterfaceDefinition::VariablePathComponent::VariablePathComponent(&local_58,local_28);
    std::
    vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
    ::push_back((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                 *)psVar1,&local_58);
    psVar1 = path_local;
    lVar3 = std::__cxx11::string::c_str();
    lVar4 = std::__cxx11::string::length();
    typePath_local._7_1_ =
         traverseVariablePath
                   ((vector<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent,_std::allocator<deqp::gles31::Functional::ProgramInterfaceDefinition::VariablePathComponent>_>
                     *)psVar1,(char *)(lVar3 + lVar4),&local_28->varType);
  }
  return typePath_local._7_1_;
}

Assistant:

static bool traverseVariablePath (std::vector<VariablePathComponent>& typePath, const std::string& path, const glu::VariableDeclaration& var)
{
	if (glu::parseVariableName(path.c_str()) != var.name)
		return false;

	typePath.push_back(VariablePathComponent(&var));
	return traverseVariablePath(typePath, path.c_str() + var.name.length(), var.varType);
}